

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O0

bool __thiscall SubCircuit<4>::propagateCheck(SubCircuit<4> *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Lit LVar4;
  uint uVar5;
  int *piVar6;
  Lit *pLVar7;
  int64_t iVar8;
  uint *puVar9;
  long in_RDI;
  int chosenIndex;
  int i_3;
  vec<int> failIndices;
  int chosenVar;
  int j_1;
  int v_1;
  vec<int> inCycle;
  int i_2;
  int j;
  int v;
  bool doOutsideIn;
  vec<int> notInCycle;
  Clause *r;
  bool foundCycle;
  int i_1;
  int chainLength;
  int nextVar;
  int startVar;
  uint i;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffe40;
  vec<int> *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe6c;
  vec<int> *in_stack_fffffffffffffe70;
  vec<int> *in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe84;
  uint in_stack_fffffffffffffe88;
  int64_t in_stack_fffffffffffffea0;
  Reason local_120;
  int in_stack_fffffffffffffeec;
  vec<int> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Reason local_100;
  int local_f4;
  vec<int> local_f0 [5];
  int local_9c;
  int local_84;
  uint local_80;
  int local_7c;
  vec<int> local_78;
  uint local_64;
  int local_60;
  int local_5c;
  int local_58;
  byte local_41;
  vec<int> local_40;
  vec<int> *local_30;
  byte local_25;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  byte local_1;
  
  for (local_14 = 0; uVar5 = local_14, uVar2 = vec<int>::size((vec<int> *)(in_RDI + 0x50)),
      uVar5 < uVar2; local_14 = local_14 + 1) {
    piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x50),local_14);
    local_1c = *piVar6;
    local_20 = 0;
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x14); local_24 = local_24 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 0x38) + (long)local_24) = 0;
    }
    local_25 = 0;
    local_18 = local_1c;
    while (bVar1 = IntView<4>::isFixed((IntView<4> *)0x186a96), bVar1) {
      local_20 = local_20 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x38) + (long)local_1c) = 1;
      iVar8 = IntView<4>::getVal((IntView<4> *)
                                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if (iVar8 == local_18) {
        local_25 = 1;
        break;
      }
      iVar8 = IntView<4>::getVal((IntView<4> *)
                                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_1c = (int)iVar8;
    }
    if (((local_25 & 1) != 0) && (local_20 < *(int *)(in_RDI + 0x14))) {
      local_30 = (vec<int> *)0x0;
      vec<int>::vec(&local_40);
      local_41 = 0;
      if ((so.lazy & 1U) != 0) {
        if (so.checkexpl == 1) {
          local_30 = (vec<int> *)::Reason_new(in_stack_fffffffffffffe34);
          local_58 = local_18;
          for (local_5c = 1; local_5c <= local_20; local_5c = local_5c + 1) {
            local_60 = (int)IntView<4>::getValLit
                                      ((IntView<4> *)
                                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                                      );
            pLVar7 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                                                ),in_stack_fffffffffffffe2c);
            pLVar7->x = local_60;
            iVar8 = IntView<4>::getVal((IntView<4> *)
                                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      );
            local_58 = (int)iVar8;
          }
        }
        else {
          vec<int>::growTo((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                           ,in_stack_fffffffffffffe2c);
          for (local_64 = 0; uVar5 = local_64, (int)local_64 < *(int *)(in_RDI + 0x14);
              local_64 = local_64 + 1) {
            puVar9 = (uint *)vec<int>::operator[](&local_40,local_64);
            *puVar9 = uVar5;
          }
          vec<int>::vec(&local_78);
          vec<int>::growTo((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                           ,in_stack_fffffffffffffe2c);
          local_7c = local_18;
          for (local_80 = 0; iVar3 = local_7c, (int)local_80 < local_20; local_80 = local_80 + 1) {
            piVar6 = vec<int>::operator[](&local_78,local_80);
            *piVar6 = iVar3;
            vec<int>::remove(&local_40,(char *)&local_7c);
            in_stack_fffffffffffffea0 =
                 IntView<4>::getVal((IntView<4> *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            local_7c = (int)in_stack_fffffffffffffea0;
          }
          uVar5 = vec<int>::size(&local_78);
          vec<int>::size(&local_40);
          local_30 = (vec<int> *)::Reason_new(in_stack_fffffffffffffe34);
          vec<int>::vec<int>((vec<int> *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                             in_stack_fffffffffffffe48);
          iVar3 = chooseEvidenceVar((SubCircuit<4> *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          local_84 = iVar3;
          LVar4 = IntView<4>::getLit((IntView<4> *)
                                     CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                     in_stack_fffffffffffffe2c);
          local_9c = LVar4.x;
          pLVar7 = Clause::operator[]((Clause *)
                                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                      in_stack_fffffffffffffe2c);
          pLVar7->x = local_9c;
          if (so.checkexpl == 2) {
            local_41 = 0;
          }
          else if (so.checkexpl == 3) {
            local_41 = 1;
          }
          else if (so.checkexpl == 4) {
            in_stack_fffffffffffffe88 = vec<int>::size(&local_40);
            uVar2 = vec<int>::size(&local_78);
            local_41 = in_stack_fffffffffffffe88 < uVar2;
          }
          else if (so.checkexpl == 5) {
            in_stack_fffffffffffffe84 = vec<int>::size(&local_78);
            uVar2 = vec<int>::size(&local_40);
            local_41 = in_stack_fffffffffffffe84 < uVar2;
          }
          else {
            fprintf(_stderr,"Unknown check explanation type\n");
          }
          if ((local_41 & 1) == 0) {
            in_stack_fffffffffffffe70 = local_30;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe28 = 0xffffffff;
            explainAcantreachB((SubCircuit<4> *)CONCAT44(uVar5,iVar3),
                               (Clause *)CONCAT44(LVar4.x,in_stack_fffffffffffffe88),
                               in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
                               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                               (int)in_stack_fffffffffffffea0);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                          );
          }
          else {
            in_stack_fffffffffffffe78 = local_30;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe28 = 0xffffffff;
            explainAcantreachB((SubCircuit<4> *)CONCAT44(uVar5,iVar3),
                               (Clause *)CONCAT44(LVar4.x,in_stack_fffffffffffffe88),
                               in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
                               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                               (int)in_stack_fffffffffffffea0);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                          );
          }
          vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        }
      }
      vec<int>::vec(local_f0);
      for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x14); local_f4 = local_f4 + 1) {
        if ((*(byte *)(*(long *)(in_RDI + 0x38) + (long)local_f4) & 1) == 0) {
          bVar1 = IntView<4>::setValNotR
                            ((IntView<4> *)in_stack_fffffffffffffe40._pt,
                             CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
          in_stack_fffffffffffffe6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe6c);
          if (bVar1) {
            bVar1 = IntView<4>::remValNotR
                              ((IntView<4> *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            in_stack_fffffffffffffe6c =
                 CONCAT13((char)((uint)in_stack_fffffffffffffe6c >> 0x18),
                          CONCAT12(bVar1,(short)in_stack_fffffffffffffe6c));
            if (bVar1) {
              Reason::Reason(&local_100,(Clause *)local_30);
              bVar1 = IntView<4>::setVal((IntView<4> *)
                                         CONCAT17(in_stack_fffffffffffffe3f,
                                                  in_stack_fffffffffffffe38),
                                         CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30),
                                         (Reason)in_stack_fffffffffffffe40,
                                         SUB41(in_stack_fffffffffffffe2c >> 0x18,0));
              in_stack_fffffffffffffe54 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                fprintf(_stderr,"unexpected fail\n");
              }
            }
            else {
              vec<int>::push((vec<int> *)in_stack_fffffffffffffe40._pt,
                             (int *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
            }
          }
        }
      }
      uVar5 = vec<int>::size(local_f0);
      if (uVar5 == 0) {
        bVar1 = false;
      }
      else {
        vec<int>::vec<int>((vec<int> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           ,in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe50 =
             chooseEvidenceVar((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        in_stack_fffffffffffffe40 =
             (anon_union_8_2_743a5d44_for_Reason_0)(long)in_stack_fffffffffffffe50;
        in_stack_fffffffffffffe48 =
             (vec<int> *)(*(long *)(in_RDI + 0x18) + in_stack_fffffffffffffe40._a * 0x10);
        in_stack_fffffffffffffefc = in_stack_fffffffffffffe50;
        Reason::Reason(&local_120,(Clause *)local_30);
        in_stack_fffffffffffffe3f =
             IntView<4>::setVal((IntView<4> *)
                                CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                (Reason)in_stack_fffffffffffffe40,
                                SUB41(in_stack_fffffffffffffe2c >> 0x18,0));
        if ((bool)in_stack_fffffffffffffe3f) {
          fprintf(_stderr,"unexpected success\n");
        }
        local_1 = 0;
        bVar1 = true;
      }
      vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if (bVar1) goto LAB_00187515;
    }
    if ((local_25 & 1) != 0) break;
  }
  local_1 = 1;
LAB_00187515:
  return (bool)(local_1 & 1);
}

Assistant:

bool propagateCheck() {
		// for each newly fixed variable, follow the chain and if you find a circuit
		// then any variable not in the circuit must have its own index as a value
		for (unsigned int i = 0; i < new_fixed.size(); i++) {
			// new_fixed should only contain variables fixed to values other than their own indices
			const int startVar = new_fixed[i];
			assert(x[startVar].isFixed());
			assert(x[startVar].getVal() != startVar);
			int nextVar = startVar;
			int chainLength = 0;

			// Clear the inCircuit array
			for (int i = 0; i < size; i++) {
				inCircuit[i] = false;
			}

			bool foundCycle = false;
			while (x[nextVar].isFixed()) {
				chainLength++;
				inCircuit[nextVar] = true;
				assert(chainLength <= size);
				if (x[nextVar].getVal() == startVar) {
					foundCycle = true;
					break;
				}
				nextVar = static_cast<int>(x[nextVar].getVal());
			}
			if (foundCycle && chainLength < size) {
				// fprintf(stderr,"found cycle length %d\n", chainLength);
				//  all variables not in the cycle must have their own indices as values
				Clause* r = nullptr;
				vec<int> notInCycle;
				bool doOutsideIn = false;
				if (so.lazy) {
					/*  r = Reason_new(chainLength + 1);
						int v = startVar;
						for(int j = 1 ; j <= chainLength; j++)
						{
								(*r)[j] = x[v].getValLit();
								v = x[v].getVal();
						}*/
					if (so.checkexpl == 1) {
						// equalities
						r = Reason_new(chainLength + 1);
						int v = startVar;
						for (int j = 1; j <= chainLength; j++) {
							(*r)[j] = x[v].getValLit();
							v = static_cast<int>(x[v].getVal());
						}
					} else {
						// find the vars in and not in the cycle
						notInCycle.growTo(size);
						for (int i = 0; i < size; i++) {
							notInCycle[i] = i;
						}
						vec<int> inCycle;
						inCycle.growTo(chainLength);
						int v = startVar;
						for (int j = 0; j < chainLength; j++) {
							inCycle[j] = v;
							notInCycle.remove(v);
							v = static_cast<int>(x[v].getVal());
						}
						r = Reason_new(inCycle.size() * notInCycle.size() + 2);
						// the first literal is an evidence literal from inside the circuit
						// choose the one from the highest level?
						const int chosenVar = chooseEvidenceVar(inCycle, so.checkevidence);
						(*r)[1] = x[chosenVar].getLit(chosenVar, LR_EQ);  // xi == i (is false)

						if (so.checkexpl == 2) {  // inside can't reach out
							doOutsideIn = false;
						} else if (so.checkexpl == 3) {  // outside can't reach in
							doOutsideIn = true;
						} else if (so.checkexpl == 4) {  // smaller group can't reach bigger group
							doOutsideIn = notInCycle.size() < inCycle.size();
						} else if (so.checkexpl == 5) {  // bigger group can't reach smaller group
							doOutsideIn = inCycle.size() < notInCycle.size();
						} else {
							fprintf(stderr, "Unknown check explanation type\n");
						}

						if (doOutsideIn) {
							explainAcantreachB(r, 2, notInCycle, inCycle);
						} else {
							explainAcantreachB(r, 2, inCycle, notInCycle);
						}
					}
				}

				// set all vars not in circuit to have own index as value
				// if one or more cannot do so, we need to choose which one(s)
				// to add clauses for.
				// options are: 1-first, 2-last, 3-high level, 4-low level
				vec<int> failIndices;
				for (int i = 0; i < size; i++) {
					if (!inCircuit[i]) {
						if (x[i].setValNotR(i)) {
							if (!x[i].remValNotR(i)) {
								failIndices.push(i);
								// fprintf(stderr,"prune\n");
							} else if (!x[i].setVal(i, r)) {
								fprintf(stderr, "unexpected fail\n");
							}
						}
					}
				}
				// now do the failing one(s) if there are any
				if (failIndices.size() > 0) {
					const int chosenIndex = chooseEvidenceVar(failIndices, so.checkevidence);
					if (x[chosenIndex].setVal(chosenIndex, r)) {
						fprintf(stderr, "unexpected success\n");
					}
					return false;
				}
			}

			// If we found a cycle stop here as all other fixed vars will be in the
			// same cycle (or we would have returned false already).
			if (foundCycle) {
				break;
			}
		}

		return true;
	}